

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderTessellationMaxInOut::compareValues
          (TessellationShaderTessellationMaxInOut *this,char *description,GLfloat *reference_values,
          int n_reference_values)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  MessageBuilder *pMVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar8 = 0;
  lVar5 = (**(code **)(lVar4 + 0xd00))(0x8c8e,0,(long)(n_reference_values << 5),1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb29);
  lVar7 = 0;
  do {
    if (n_reference_values << 2 <= lVar7) {
LAB_00d25bc7:
      (**(code **)(lVar4 + 0x1670))(0x8c8e);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0xb44);
      return n_reference_values << 2 <= lVar7;
    }
    fVar9 = *(float *)(lVar5 + lVar8) - *(float *)((long)reference_values + lVar8);
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (1e-05 < fVar10) {
LAB_00d25a33:
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,description);
      std::operator<<(&local_1a8,": captured results ");
      std::operator<<(&local_1a8,"vec4(");
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(float *)(lVar5 + lVar8))
      ;
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar5 + lVar8 + 4));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar5 + lVar8 + 8));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar5 + lVar8 + 0xc));
      poVar1 = &pMVar6->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,") ");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "are different from the expected values ");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"vec4(");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)reference_values + lVar8));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)reference_values + lVar8 + 4))
      ;
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)reference_values + lVar8 + 8))
      ;
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(float *)((long)reference_values + lVar8 + 0xc));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      goto LAB_00d25bc7;
    }
    fVar9 = *(float *)(lVar5 + 4 + lVar8) - *(float *)((long)reference_values + lVar8 + 4);
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (1e-05 < fVar10) goto LAB_00d25a33;
    fVar9 = *(float *)(lVar5 + 8 + lVar8) - *(float *)((long)reference_values + lVar8 + 8);
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (1e-05 < fVar10) goto LAB_00d25a33;
    fVar9 = *(float *)(lVar5 + 0xc + lVar8) - *(float *)((long)reference_values + lVar8 + 0xc);
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (1e-05 < fVar10) goto LAB_00d25a33;
    lVar7 = lVar7 + 4;
    lVar8 = lVar8 + 0x10;
  } while( true );
}

Assistant:

bool TessellationShaderTessellationMaxInOut::compareValues(char const* description, glw::GLfloat* reference_values,
														   int n_reference_values)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Map the buffer storage into process space. */
	glw::GLint bo_size = static_cast<glw::GLint>(2 /* number of vertices */ * sizeof(glw::GLfloat) *
												 n_reference_values * 4); /* number of components */
	glw::GLfloat* resultFloats =
		(glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Verify the data */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_passed = true;

	for (int i = 0; i < n_reference_values * 4 /* number of components */; i += 4 /* number of components */)
	{
		if ((de::abs(resultFloats[i] - reference_values[i]) > epsilon) ||
			(de::abs(resultFloats[i + 1] - reference_values[i + 1]) > epsilon) ||
			(de::abs(resultFloats[i + 2] - reference_values[i + 2]) > epsilon) ||
			(de::abs(resultFloats[i + 3] - reference_values[i + 3]) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << description << ": captured results "
							   << "vec4(" << resultFloats[i + 0] << ", " << resultFloats[i + 1] << ", "
							   << resultFloats[i + 2] << ", " << resultFloats[i + 3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << reference_values[i + 0] << ", " << reference_values[i + 1] << ", "
							   << reference_values[i + 2] << ", " << reference_values[i + 3] << ")."
							   << tcu::TestLog::EndMessage;

			test_passed = false;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return test_passed;
}